

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::BasicMax::CheckIndexed(BasicMax *this,GLenum target,GLint *min_values)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLint i;
  GLint64 i64;
  int local_34;
  int local_30 [2];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar1 = 0;
  do {
    glu::CallLogWrapper::glGetIntegeri_v(this_00,target,(GLuint)lVar1,&local_34);
    if (local_34 < min_values[lVar1]) goto LAB_00c0ea9a;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  while (glu::CallLogWrapper::glGetInteger64i_v(this_00,target,(GLuint)lVar1,(GLint64 *)local_30),
        min_values[lVar1] <= local_30[0]) {
    lVar1 = lVar1 + 1;
    if (lVar1 == 3) {
      return true;
    }
  }
LAB_00c0ea9a:
  anon_unknown_0::Output("Is %d should be at least %d.\n");
  return false;
}

Assistant:

bool CheckIndexed(GLenum target, const GLint* min_values)
	{
		GLint   i;
		GLint64 i64;

		for (GLuint c = 0; c < 3; c++)
		{
			glGetIntegeri_v(target, c, &i);
			if (i < min_values[c])
			{
				Output("Is %d should be at least %d.\n", i, min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetInteger64i_v(target, c, &i64);
			if (static_cast<GLint>(i64) < min_values[c])
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_values[c]);
				return false;
			}
		}

		return true;
	}